

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O2

bool __thiscall tcmalloc::Logger::AddStr(Logger *this,char *str,int n)

{
  size_t __n;
  long lVar1;
  
  lVar1 = (long)this->end_ - (long)this->p_;
  __n = (size_t)n;
  if ((long)__n <= lVar1) {
    memcpy(this->p_,str,__n);
    this->p_ = this->p_ + __n;
  }
  return (long)__n <= lVar1;
}

Assistant:

bool Logger::AddStr(const char* str, int n) {
  if (end_ - p_ < n) {
    return false;
  } else {
    memcpy(p_, str, n);
    p_ += n;
    return true;
  }
}